

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Acb_CollectIntNodes(Gia_Man_t *p,Vec_Int_t *vNodes0,Vec_Int_t *vNodes1)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  vNodes0->nSize = 0;
  vNodes1->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_00397ce6:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  iVar1 = p->nTravIds;
  piVar3 = p->pTravIds;
  *piVar3 = iVar1;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    piVar4 = pVVar5->pArray;
    lVar8 = 0;
    do {
      iVar6 = piVar4[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00397cc7;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar6) goto LAB_00397ce6;
      piVar3[iVar6] = iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p->vCos;
  uVar7 = (ulong)(uint)pVVar5->nSize;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      iVar6 = (int)uVar7;
      iVar1 = pVVar5->pArray[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00397cc7;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (lVar8 != 0) {
        pGVar2 = p->pObjs + iVar1;
        Acb_CollectIntNodes_rec
                  (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vNodes1);
        pVVar5 = p->vCos;
      }
      lVar8 = lVar8 + 1;
      iVar6 = pVVar5->nSize;
      uVar7 = (ulong)iVar6;
    } while (lVar8 < (long)uVar7);
    if (0 < iVar6) {
      lVar8 = 0;
      do {
        iVar1 = pVVar5->pArray[lVar8];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00397cc7:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        if (lVar8 == 0) {
          pGVar2 = p->pObjs + iVar1;
          Acb_CollectIntNodes_rec
                    (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vNodes0);
          pVVar5 = p->vCos;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar5->nSize);
    }
  }
  return;
}

Assistant:

void Acb_CollectIntNodes( Gia_Man_t * p, Vec_Int_t * vNodes0, Vec_Int_t * vNodes1 )
{
    Gia_Obj_t * pObj; int i;
    Vec_IntClear( vNodes0 );
    Vec_IntClear( vNodes1 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCi( p, pObj, i )
        Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManForEachCo( p, pObj, i )
        if ( i > 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes1 );
    Gia_ManForEachCo( p, pObj, i )
        if ( i == 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes0 );
}